

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O0

ON_SubDComponentPtr __thiscall
ON_SubDComponentIterator::NextComponent(ON_SubDComponentIterator *this)

{
  Type TVar1;
  ON_SubDVertex *pOVar2;
  ON_SubDEdge *pOVar3;
  ON_SubDComponentPtr OVar4;
  ON_SubDFace *pOVar5;
  ON_SubDFace *face;
  ON_SubDEdge *edge;
  ON_SubDVertex *vertex;
  ON_SubDComponentIterator *this_local;
  
  TVar1 = ON_SubDComponentPtr::ComponentType(&this->m_cptr_current);
  if (TVar1 == Vertex) {
    pOVar2 = (ON_SubDVertex *)((this->m_cptr_current).m_ptr & 0xfffffffffffffff8);
    if (((pOVar2 != (ON_SubDVertex *)0x0) && (pOVar2 != this->m_vertex_last)) &&
       (pOVar2->m_next_vertex != (ON_SubDVertex *)0x0)) {
      OVar4 = ON_SubDComponentPtr::Create(pOVar2->m_next_vertex);
      (this->m_cptr_current).m_ptr = OVar4.m_ptr;
      return (ON_SubDComponentPtr)(this->m_cptr_current).m_ptr;
    }
    (this->m_cptr_current).m_ptr = 0;
LAB_008fa3a6:
    if (((this->m_cptr_current).m_ptr == 0) && (this->m_edge_first != (ON_SubDEdge *)0x0)) {
      OVar4 = ON_SubDComponentPtr::Create(this->m_edge_first);
      (this->m_cptr_current).m_ptr = OVar4.m_ptr;
      return (ON_SubDComponentPtr)(this->m_cptr_current).m_ptr;
    }
    pOVar3 = (ON_SubDEdge *)((this->m_cptr_current).m_ptr & 0xfffffffffffffff8);
    if (((pOVar3 != (ON_SubDEdge *)0x0) && (pOVar3 != this->m_edge_last)) &&
       (pOVar3->m_next_edge != (ON_SubDEdge *)0x0)) {
      OVar4 = ON_SubDComponentPtr::Create(pOVar3->m_next_edge);
      (this->m_cptr_current).m_ptr = OVar4.m_ptr;
      return (ON_SubDComponentPtr)(this->m_cptr_current).m_ptr;
    }
    (this->m_cptr_current).m_ptr = 0;
  }
  else {
    if (TVar1 == Edge) goto LAB_008fa3a6;
    if (TVar1 != Face) goto LAB_008fa510;
  }
  if (((this->m_cptr_current).m_ptr == 0) && (this->m_face_first != (ON_SubDFace *)0x0)) {
    OVar4 = ON_SubDComponentPtr::Create(this->m_face_first);
    (this->m_cptr_current).m_ptr = OVar4.m_ptr;
    return (ON_SubDComponentPtr)(this->m_cptr_current).m_ptr;
  }
  pOVar5 = (ON_SubDFace *)((this->m_cptr_current).m_ptr & 0xfffffffffffffff8);
  if (((pOVar5 != (ON_SubDFace *)0x0) && (pOVar5 != this->m_face_last)) &&
     (pOVar5->m_next_face != (ON_SubDFace *)0x0)) {
    OVar4 = ON_SubDComponentPtr::Create(pOVar5->m_next_face);
    (this->m_cptr_current).m_ptr = OVar4.m_ptr;
    return (ON_SubDComponentPtr)(this->m_cptr_current).m_ptr;
  }
  (this->m_cptr_current).m_ptr = 0;
LAB_008fa510:
  return (ON_SubDComponentPtr)(this->m_cptr_current).m_ptr;
}

Assistant:

const class ON_SubDComponentPtr ON_SubDComponentIterator::NextComponent()
{
  switch (m_cptr_current.ComponentType())
  {
  case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* vertex = ON_SUBD_VERTEX_POINTER(m_cptr_current.m_ptr);
      if (nullptr != vertex && vertex != m_vertex_last && nullptr != vertex->m_next_vertex)
      {
        m_cptr_current = ON_SubDComponentPtr::Create(vertex->m_next_vertex);
        return m_cptr_current;
      }
    }
    m_cptr_current = ON_SubDComponentPtr::Null;
    // no break here

  case ON_SubDComponentPtr::Type::Edge:
    {
      if (0 == m_cptr_current.m_ptr && nullptr != m_edge_first)
      {
        // switching from vertex to edge
        m_cptr_current = ON_SubDComponentPtr::Create(m_edge_first);
        return m_cptr_current;
      }
      const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(m_cptr_current.m_ptr);
      if (nullptr != edge && edge != m_edge_last && nullptr != edge->m_next_edge )
      {
        m_cptr_current = ON_SubDComponentPtr::Create(edge->m_next_edge);
        return m_cptr_current;
      }
    }
    m_cptr_current = ON_SubDComponentPtr::Null;
    // no break here

  case ON_SubDComponentPtr::Type::Face:
    {
      if (0 == m_cptr_current.m_ptr && nullptr != m_face_first)
      {
        // switching from edge to face
        m_cptr_current = ON_SubDComponentPtr::Create(m_face_first);
        return m_cptr_current;
      }
      const ON_SubDFace* face = ON_SUBD_FACE_POINTER(m_cptr_current.m_ptr);
      if (nullptr != face && face != m_face_last && nullptr != face->m_next_face)
      {
        m_cptr_current = ON_SubDComponentPtr::Create(face->m_next_face);
        return m_cptr_current;
      }
    }
    m_cptr_current = ON_SubDComponentPtr::Null;
    break;

  default:
    break;
  }
  
  return m_cptr_current;
}